

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixEnv::Schedule
          (PosixEnv *this,_func_void_void_ptr *background_work_function,void *background_work_arg)

{
  _Map_pointer __src;
  ulong uVar1;
  int iVar2;
  int extraout_EAX;
  _Map_pointer ppBVar3;
  BackgroundWorkItem *pBVar4;
  _Elt_pointer pBVar5;
  size_t sVar6;
  long lVar7;
  _Map_pointer ppBVar8;
  long lVar9;
  long lVar10;
  _Map_pointer __dest;
  thread background_thread;
  long local_50;
  long *local_48;
  PosixEnv *local_40;
  long local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->background_work_mutex_);
  if (iVar2 != 0) {
LAB_0012059c:
    std::__throw_system_error(iVar2);
  }
  if (this->started_background_thread_ == false) {
    this->started_background_thread_ = true;
    local_50 = 0;
    local_48 = (long *)operator_new(0x18);
    *local_48 = (long)&PTR___State_00136c70;
    local_48[1] = (long)this;
    local_48[2] = (long)BackgroundThreadEntryPoint;
    std::thread::_M_start_thread(&local_50,&local_48,0);
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 8))();
    }
    std::thread::detach();
    if (local_50 != 0) {
      std::terminate();
    }
  }
  if ((this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    std::condition_variable::notify_one();
  }
  pBVar5 = (this->background_work_queue_).c.
           super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar5 != (this->background_work_queue_).c.
                super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    pBVar5->function = background_work_function;
    pBVar5->arg = background_work_arg;
    pBVar5 = pBVar5 + 1;
    goto LAB_00120579;
  }
  ppBVar8 = (this->background_work_queue_).c.
            super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  __src = (this->background_work_queue_).c.
          super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
          ._M_impl.super__Deque_impl_data._M_start._M_node;
  lVar10 = (long)ppBVar8 - (long)__src >> 3;
  if (((long)(this->background_work_queue_).c.
             super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)(this->background_work_queue_).c.
             super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
      ((long)pBVar5 -
       (long)(this->background_work_queue_).c.
             super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
      (lVar10 + -1 + (ulong)(ppBVar8 == (_Map_pointer)0x0)) * 0x20 == 0x7ffffffffffffff) {
    std::__throw_length_error("cannot create std::deque larger than max_size()");
  }
  ppBVar3 = (this->background_work_queue_).c.
            super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
            ._M_impl.super__Deque_impl_data._M_map;
  uVar1 = (this->background_work_queue_).c.
          super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
          ._M_impl.super__Deque_impl_data._M_map_size;
  if (uVar1 - ((long)ppBVar8 - (long)ppBVar3 >> 3) < 2) {
    lVar9 = lVar10 + 1;
    if (lVar10 * 2 + 4U < uVar1) {
      __dest = (_Map_pointer)((long)ppBVar3 + (uVar1 - (lVar10 + 2) & 0xfffffffffffffffe) * 4);
      if (__dest < __src) {
        sVar6 = (long)ppBVar8 + (8 - (long)__src);
        ppBVar8 = __dest;
        if (sVar6 != 0) {
LAB_001204dc:
          memmove(ppBVar8,__src,sVar6);
        }
      }
      else {
        sVar6 = (long)ppBVar8 + (8 - (long)__src);
        if (sVar6 != 0) {
          ppBVar8 = (_Map_pointer)((long)__dest + (lVar9 * 8 - sVar6));
          goto LAB_001204dc;
        }
      }
    }
    else {
      lVar7 = uVar1 * 2 + (ulong)(uVar1 == 0);
      local_40 = (PosixEnv *)(lVar7 + 2);
      local_38 = lVar9;
      if ((ulong)local_40 >> 0x3c != 0) {
        _GLOBAL__N_1::PosixEnv::Schedule(local_40);
        iVar2 = extraout_EAX;
        goto LAB_0012059c;
      }
      ppBVar3 = (_Map_pointer)operator_new((long)local_40 * 8);
      __dest = (_Map_pointer)((long)ppBVar3 + (lVar7 - lVar10 & 0xfffffffffffffffeU) * 4);
      ppBVar8 = (this->background_work_queue_).c.
                super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      sVar6 = (long)(this->background_work_queue_).c.
                    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node + (8 - (long)ppBVar8);
      if (sVar6 != 0) {
        memmove(__dest,ppBVar8,sVar6);
      }
      operator_delete((this->background_work_queue_).c.
                      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
                      ._M_impl.super__Deque_impl_data._M_map);
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_map = ppBVar3;
      (this->background_work_queue_).c.
      super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
      ._M_impl.super__Deque_impl_data._M_map_size = (size_t)local_40;
      lVar9 = local_38;
    }
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node = __dest;
    pBVar4 = *__dest;
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first = pBVar4;
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last = pBVar4 + 0x20;
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node = __dest + lVar9 + -1;
    pBVar4 = __dest[lVar9 + -1];
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first = pBVar4;
    (this->background_work_queue_).c.
    super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last = pBVar4 + 0x20;
  }
  pBVar4 = (BackgroundWorkItem *)operator_new(0x200);
  (this->background_work_queue_).c.
  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pBVar4;
  pBVar5 = (this->background_work_queue_).c.
           super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pBVar5->function = background_work_function;
  pBVar5->arg = background_work_arg;
  ppBVar8 = (this->background_work_queue_).c.
            super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  (this->background_work_queue_).c.
  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = ppBVar8 + 1;
  pBVar5 = ppBVar8[1];
  (this->background_work_queue_).c.
  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = pBVar5;
  (this->background_work_queue_).c.
  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = pBVar5 + 0x20;
LAB_00120579:
  (this->background_work_queue_).c.
  super__Deque_base<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = pBVar5;
  pthread_mutex_unlock((pthread_mutex_t *)&this->background_work_mutex_);
  return;
}

Assistant:

void PosixEnv::Schedule(
    void (*background_work_function)(void* background_work_arg),
    void* background_work_arg) {
  background_work_mutex_.Lock();

  // Start the background thread, if we haven't done so already.
  if (!started_background_thread_) {
    started_background_thread_ = true;
    std::thread background_thread(PosixEnv::BackgroundThreadEntryPoint, this);
    background_thread.detach();
  }

  // If the queue is empty, the background thread may be waiting for work.
  if (background_work_queue_.empty()) {
    background_work_cv_.Signal();
  }

  background_work_queue_.emplace(background_work_function, background_work_arg);
  background_work_mutex_.Unlock();
}